

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O3

double __thiscall ipx::Basis::MinSingularValue(Basis *this)

{
  ulong __n;
  undefined1 auVar1 [16];
  double *pdVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  Vector v;
  Vector local_50;
  double local_40;
  Vector local_38;
  double local_28;
  
  iVar3 = this->model_->num_rows_;
  sVar4 = (size_t)iVar3;
  __n = sVar4 * 8;
  local_50._M_size = sVar4;
  pdVar2 = (double *)operator_new(__n);
  local_50._M_data = pdVar2;
  memset(pdVar2,0,__n);
  local_38._M_size = sVar4;
  local_38._M_data = (double *)operator_new(__n);
  memset(local_38._M_data,0,__n);
  auVar1 = _DAT_003beea0;
  if (0 < iVar3) {
    lVar5 = sVar4 - 1;
    auVar7._8_4_ = (int)lVar5;
    auVar7._0_8_ = lVar5;
    auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar5 = 0;
    auVar7 = auVar7 ^ _DAT_003beea0;
    auVar8 = _DAT_003bee90;
    do {
      auVar9 = auVar8 ^ auVar1;
      lVar10 = auVar8._8_8_;
      if ((bool)(~(auVar9._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar9._0_4_ ||
                  auVar7._4_4_ < auVar9._4_4_) & 1)) {
        *(double *)((long)pdVar2 + lVar5) = 1.0 / (double)(int)(auVar8._0_8_ + 1) + 1.0;
      }
      if ((auVar9._12_4_ != auVar7._12_4_ || auVar9._8_4_ <= auVar7._8_4_) &&
          auVar9._12_4_ <= auVar7._12_4_) {
        *(double *)((long)pdVar2 + lVar5 + 8) = 1.0 / (double)(int)(lVar10 + 1) + 1.0;
      }
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar10 + 2;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(iVar3 + 1U >> 1) << 4 != lVar5);
  }
  dVar6 = Twonorm(&local_50);
  if (0 < (long)local_50._M_size) {
    pdVar2 = local_50._M_data;
    do {
      *pdVar2 = *pdVar2 / dVar6;
      pdVar2 = pdVar2 + 1;
    } while (pdVar2 < local_50._M_data + local_50._M_size);
  }
  iVar3 = 0;
  dVar6 = 0.0;
  do {
    if (iVar3 == 100) break;
    local_40 = dVar6;
    LuUpdate::SolveDense
              ((this->lu_)._M_t.
               super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>._M_t.
               super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>.
               super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl,&local_50,&local_38,'N');
    LuUpdate::SolveDense
              ((this->lu_)._M_t.
               super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>._M_t.
               super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>.
               super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl,&local_38,&local_38,'T');
    dVar6 = Twonorm(&local_38);
    if (local_50._M_size == local_38._M_size) {
      if (local_50._M_size != 0) {
        sVar4 = 0;
        do {
          local_50._M_data[sVar4] = local_38._M_data[sVar4] / dVar6;
          sVar4 = sVar4 + 1;
        } while (local_50._M_size != sVar4);
      }
    }
    else {
      local_28 = dVar6;
      if (local_50._M_data != (double *)0x0) {
        operator_delete(local_50._M_data);
      }
      local_50._M_size = local_38._M_size;
      local_50._M_data = (double *)operator_new(local_38._M_size << 3);
      dVar6 = local_28;
      if (local_50._M_size != 0) {
        sVar4 = 0;
        do {
          local_50._M_data[sVar4] = local_38._M_data[sVar4] / local_28;
          sVar4 = sVar4 + 1;
        } while (local_50._M_size != sVar4);
      }
    }
    iVar3 = iVar3 + 1;
  } while (dVar6 * 0.001 < ABS(dVar6 - local_40));
  local_28 = dVar6;
  operator_delete(local_38._M_data);
  dVar6 = 1.0 / local_28;
  if (dVar6 < 0.0) {
    local_40 = sqrt(dVar6);
  }
  else {
    local_40 = SQRT(dVar6);
  }
  operator_delete(local_50._M_data);
  return local_40;
}

Assistant:

double Basis::MinSingularValue() const {
    const Int m = model_.rows();
    Vector v(m);

    // Computes maximum eigenvalue of inverse(B*B').
    double lambda = PowerMethod(
        [this](const Vector& x, Vector& fx) {
            SolveDense(x, fx, 'N');
            SolveDense(fx, fx, 'T'); }, v);
    return std::sqrt(1.0/lambda);
}